

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfmon_inl.h
# Opt level: O0

Counter * __thiscall
perfmon::Counters::operator[](Counter *__return_storage_ptr__,Counters *this,char *name)

{
  bool bVar1;
  int iVar2;
  pointer this_00;
  string *__lhs;
  reference pCVar3;
  __normal_iterator<const_perfmon::Counter_*,_std::vector<perfmon::Counter,_std::allocator<perfmon::Counter>_>_>
  local_28;
  __normal_iterator<const_perfmon::Counter_*,_std::vector<perfmon::Counter,_std::allocator<perfmon::Counter>_>_>
  local_20;
  const_iterator it;
  char *name_local;
  Counters *this_local;
  
  it._M_current = (Counter *)name;
  local_20._M_current =
       (Counter *)
       std::vector<perfmon::Counter,_std::allocator<perfmon::Counter>_>::begin
                 (&this->super_vector<perfmon::Counter,_std::allocator<perfmon::Counter>_>);
  while( true ) {
    local_28._M_current =
         (Counter *)
         std::vector<perfmon::Counter,_std::allocator<perfmon::Counter>_>::end
                   (&this->super_vector<perfmon::Counter,_std::allocator<perfmon::Counter>_>);
    bVar1 = __gnu_cxx::operator!=(&local_20,&local_28);
    if (!bVar1) {
      if ((operator[](char_const*)::NONE_abi_cxx11_ == '\0') &&
         (iVar2 = __cxa_guard_acquire(&operator[](char_const*)::NONE_abi_cxx11_), iVar2 != 0)) {
        std::__cxx11::string::string((string *)&operator[](char_const*)::NONE_abi_cxx11_);
        __cxa_atexit(std::__cxx11::string::~string,&operator[](char_const*)::NONE_abi_cxx11_,
                     &__dso_handle);
        __cxa_guard_release(&operator[](char_const*)::NONE_abi_cxx11_);
      }
      Counter::Counter(__return_storage_ptr__,&operator[](char_const*)::NONE_abi_cxx11_,0,0);
      return __return_storage_ptr__;
    }
    this_00 = __gnu_cxx::
              __normal_iterator<const_perfmon::Counter_*,_std::vector<perfmon::Counter,_std::allocator<perfmon::Counter>_>_>
              ::operator->(&local_20);
    __lhs = Counter::Name_abi_cxx11_(this_00);
    bVar1 = std::operator==(__lhs,(char *)it._M_current);
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_perfmon::Counter_*,_std::vector<perfmon::Counter,_std::allocator<perfmon::Counter>_>_>
    ::operator++(&local_20);
  }
  pCVar3 = __gnu_cxx::
           __normal_iterator<const_perfmon::Counter_*,_std::vector<perfmon::Counter,_std::allocator<perfmon::Counter>_>_>
           ::operator*(&local_20);
  __return_storage_ptr__->name_ptr_ = pCVar3->name_ptr_;
  __return_storage_ptr__->calls_ = pCVar3->calls_;
  __return_storage_ptr__->ticks_ = pCVar3->ticks_;
  return __return_storage_ptr__;
}

Assistant:

inline Counter Counters::operator[](const char *name) const {
  for (auto it = begin(); it != end(); ++it) {
    if (it->Name() == name) {
      return *it;
    }
  }
  static const std::string NONE;
  return Counter(&NONE, 0, 0);
}